

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

uint uv__kernel_version(void)

{
  int iVar1;
  uint uVar2;
  char *__s;
  char *needle;
  char v_sig [256];
  int local_1a0;
  uint patch;
  uint minor;
  uint major;
  uint version;
  utsname u;
  
  minor = uv__kernel_version::cached_version;
  if (uv__kernel_version::cached_version == 0) {
    iVar1 = uv__slurp("/proc/version_signature",(char *)&needle,0x100);
    if ((iVar1 != 0) ||
       (iVar1 = sscanf((char *)&needle,"Ubuntu %*s %u.%u.%u",&patch,&local_1a0,v_sig + 0xfc),
       iVar1 != 3)) {
      iVar1 = uname((utsname *)((long)&major + 2));
      if (iVar1 == -1) {
        return 0;
      }
      __s = strstr(u.release + 0x39,"Debian ");
      if ((__s == (char *)0x0) ||
         (iVar1 = sscanf(__s,"Debian %u.%u.%u",&patch,&local_1a0,v_sig + 0xfc), iVar1 != 3)) {
        iVar1 = sscanf(u.nodename + 0x39,"%u.%u.%u",&patch,&local_1a0,v_sig + 0xfc);
        if (iVar1 != 3) {
          return 0;
        }
        if ((patch == 2) && (local_1a0 == 6)) {
          if ((uint)v_sig._252_4_ < 0x3c) {
            if (0x27 < (uint)v_sig._252_4_) {
              patch = 3;
              local_1a0 = v_sig._252_4_ + -0x28;
              v_sig[0xfc] = '\0';
              v_sig[0xfd] = '\0';
              v_sig[0xfe] = '\0';
              v_sig[0xff] = '\0';
            }
          }
          else {
            patch = 4;
            local_1a0 = v_sig._252_4_ + -0x3c;
            v_sig[0xfc] = '\0';
            v_sig[0xfd] = '\0';
            v_sig[0xfe] = '\0';
            v_sig[0xff] = '\0';
          }
        }
      }
    }
    u.domainname._57_4_ = patch * 0x10000 + local_1a0 * 0x100 + v_sig._252_4_;
  }
  else {
    u.domainname._57_4_ = uv__kernel_version::cached_version;
  }
  uVar2._0_1_ = u.domainname[0x39];
  uVar2._1_1_ = u.domainname[0x3a];
  uVar2._2_1_ = u.domainname[0x3b];
  uVar2._3_1_ = u.domainname[0x3c];
  uv__kernel_version::cached_version._0_1_ = u.domainname[0x39];
  uv__kernel_version::cached_version._1_1_ = u.domainname[0x3a];
  uv__kernel_version::cached_version._2_1_ = u.domainname[0x3b];
  uv__kernel_version::cached_version._3_1_ = u.domainname[0x3c];
  return uVar2;
}

Assistant:

unsigned uv__kernel_version(void) {
  static _Atomic unsigned cached_version;
  struct utsname u;
  unsigned version;
  unsigned major;
  unsigned minor;
  unsigned patch;
  char v_sig[256];
  char* needle;

  version = atomic_load_explicit(&cached_version, memory_order_relaxed);
  if (version != 0)
    return version;

  /* Check /proc/version_signature first as it's the way to get the mainline
   * kernel version in Ubuntu. The format is:
   *   Ubuntu ubuntu_kernel_version mainline_kernel_version
   * For example:
   *   Ubuntu 5.15.0-79.86-generic 5.15.111
   */
  if (0 == uv__slurp("/proc/version_signature", v_sig, sizeof(v_sig)))
    if (3 == sscanf(v_sig, "Ubuntu %*s %u.%u.%u", &major, &minor, &patch))
      goto calculate_version;

  if (-1 == uname(&u))
    return 0;

  /* In Debian we need to check `version` instead of `release` to extract the
   * mainline kernel version. This is an example of how it looks like:
   *  #1 SMP Debian 5.10.46-4 (2021-08-03)
   */
  needle = strstr(u.version, "Debian ");
  if (needle != NULL)
    if (3 == sscanf(needle, "Debian %u.%u.%u", &major, &minor, &patch))
      goto calculate_version;

  if (3 != sscanf(u.release, "%u.%u.%u", &major, &minor, &patch))
    return 0;

  /* Handle it when the process runs under the UNAME26 personality:
   *
   * - kernels >= 3.x identify as 2.6.40+x
   * - kernels >= 4.x identify as 2.6.60+x
   *
   * UNAME26 is a poorly conceived hack that doesn't let us distinguish
   * between 4.x kernels and 5.x/6.x kernels so we conservatively assume
   * that 2.6.60+x means 4.x.
   *
   * Fun fact of the day: it's technically possible to observe the actual
   * kernel version for a brief moment because uname() first copies out the
   * real release string before overwriting it with the backcompat string.
   */
  if (major == 2 && minor == 6) {
    if (patch >= 60) {
      major = 4;
      minor = patch - 60;
      patch = 0;
    } else if (patch >= 40) {
      major = 3;
      minor = patch - 40;
      patch = 0;
    }
  }

calculate_version:
  version = major * 65536 + minor * 256 + patch;
  atomic_store_explicit(&cached_version, version, memory_order_relaxed);

  return version;
}